

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O3

double __thiscall despot::DESPOT::CheckDESPOT(DESPOT *this,VNode *vnode,double regularized_value)

{
  DSPOMDP *pDVar1;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  int iVar5;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvVar6;
  pointer ppSVar7;
  undefined4 extraout_var;
  VNode *pVVar8;
  clock_t cVar9;
  clock_t cVar10;
  clock_t cVar11;
  clock_t cVar12;
  VNode *this_00;
  ostream *poVar13;
  int iVar14;
  ulong uVar15;
  vector<despot::State_*,_std::allocator<despot::State_*>_> copy;
  double pruned_value;
  RandomStreams streams;
  ACT_TYPE pruned_action;
  double local_c0;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_98;
  VNode *local_78;
  History *local_70;
  double local_68;
  double local_60;
  RandomStreams local_58;
  ACT_TYPE local_34;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "--------------------------------------------------------------------------------",0x50
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  pvVar6 = VNode::particles(vnode);
  local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppSVar7 = (pvVar6->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((pvVar6->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppSVar7) {
    uVar15 = 0;
    do {
      pDVar1 = (this->super_Solver).model_;
      iVar5 = (*pDVar1->_vptr_DSPOMDP[0x16])(pDVar1,ppSVar7[uVar15]);
      local_58.streams_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar5);
      std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                ((vector<despot::State*,std::allocator<despot::State*>> *)&local_98,
                 (State **)&local_58);
      uVar15 = uVar15 + 1;
      ppSVar7 = (pvVar6->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(pvVar6->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7 >> 3
                             ));
  }
  pVVar8 = (VNode *)operator_new(0x98);
  VNode::VNode(pVVar8,&local_98,0,(QNode *)0x0,0xffffffffffffffff);
  uVar3 = DAT_00192dd0;
  DAT_00192dd0 = 0;
  RandomStreams::RandomStreams(&local_58,DAT_00192dbc,DAT_00192dc0);
  RandomStreams::position(&local_58,0);
  local_70 = &(this->super_Solver).history_;
  InitBounds(pVVar8,this->lower_bound_,this->upper_bound_,&local_58,local_70);
  iVar5 = 0;
  local_c0 = 0.0;
  local_78 = pVVar8;
  do {
    local_68 = (double)iVar5 * 0.05;
    iVar14 = 1;
    do {
      cVar9 = clock();
      pVVar8 = Trial(pVVar8,&local_58,this->lower_bound_,this->upper_bound_,
                     (this->super_Solver).model_,local_70,(SearchStatistics *)0x0);
      cVar10 = clock();
      cVar11 = clock();
      Backup(pVVar8);
      iVar5 = iVar5 + 1;
      cVar12 = clock();
      pVVar8 = local_78;
      dVar2 = (double)iVar14;
      local_c0 = ((double)cVar12 - (double)cVar11) / 1000000.0 +
                 local_c0 + ((double)cVar10 - (double)cVar9) / 1000000.0;
      iVar14 = iVar14 + 1;
    } while (dVar2 <= local_68);
    DAT_00192dd0 = uVar3;
    this_00 = Prune(local_78,&local_34,&local_60);
    DAT_00192dd0 = 0;
    VNode::Free(this_00,(this->super_Solver).model_);
    VNode::~VNode(this_00);
    operator_delete(this_00,0x98);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# trials = ",0xb);
    poVar13 = (ostream *)std::ostream::operator<<(&std::cout,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"; target = ",0xb);
    poVar13 = std::ostream::_M_insert<double>(regularized_value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", current = ",0xc);
    dVar4 = local_60;
    poVar13 = std::ostream::_M_insert<double>(local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", l = ",6);
    dVar2 = VNode::lower_bound(pVVar8);
    poVar13 = std::ostream::_M_insert<double>(dVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,", u = ",6);
    dVar2 = VNode::upper_bound(pVVar8);
    poVar13 = std::ostream::_M_insert<double>(dVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"; time = ",9);
    poVar13 = std::ostream::_M_insert<double>(local_c0);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
  } while (dVar4 < regularized_value);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DESPOT: # trials = ",0x13);
  poVar13 = (ostream *)std::ostream::operator<<(&std::cout,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"; target = ",0xb);
  poVar13 = std::ostream::_M_insert<double>(regularized_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", current = ",0xc);
  poVar13 = std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", l = ",6);
  dVar2 = VNode::lower_bound(pVVar8);
  poVar13 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", u = ",6);
  dVar2 = VNode::upper_bound(pVVar8);
  poVar13 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"; time = ",9);
  poVar13 = std::ostream::_M_insert<double>(local_c0);
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  DAT_00192dd0 = uVar3;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "--------------------------------------------------------------------------------",0x50
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  VNode::Free(pVVar8,(this->super_Solver).model_);
  VNode::~VNode(pVVar8);
  operator_delete(pVVar8,0x98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_58.streams_);
  if (local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return local_c0;
}

Assistant:

double DESPOT::CheckDESPOT(const VNode* vnode, double regularized_value) {
	cout
		<< "--------------------------------------------------------------------------------"
		<< endl;

	const vector<State*>& particles = vnode->particles();
	vector<State*> copy;
	for (int i = 0; i < particles.size(); i ++) {
		copy.push_back(model_->Copy(particles[i]));
	}
	VNode* root = new VNode(copy);

	double pruning_constant = Globals::config.pruning_constant;
	Globals::config.pruning_constant = 0;

	RandomStreams streams = RandomStreams(Globals::config.num_scenarios,
		Globals::config.search_depth);

	streams.position(0);
	InitBounds(root, lower_bound_, upper_bound_, streams, history_);

	double used_time = 0;
	int num_trials = 0, prev_num = 0;
	double pruned_value;
	do {
		double start = clock();
		VNode* cur = Trial(root, streams, lower_bound_, upper_bound_, model_, history_);
		num_trials++;
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		start = clock();
		Backup(cur);
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		if (double(num_trials - prev_num) > 0.05 * prev_num) {
			ACT_TYPE pruned_action;
			Globals::config.pruning_constant = pruning_constant;
			VNode* pruned = Prune(root, pruned_action, pruned_value);
			Globals::config.pruning_constant = 0;
			prev_num = num_trials;

			pruned->Free(*model_);
			delete pruned;

			cout << "# trials = " << num_trials << "; target = "
				<< regularized_value << ", current = " << pruned_value
				<< ", l = " << root->lower_bound() << ", u = "
				<< root->upper_bound() << "; time = " << used_time << endl;

			if (pruned_value >= regularized_value) {
				break;
			}
		}
	} while (true);

	cout << "DESPOT: # trials = " << num_trials << "; target = "
		<< regularized_value << ", current = " << pruned_value << ", l = "
		<< root->lower_bound() << ", u = " << root->upper_bound() << "; time = "
		<< used_time << endl;
	Globals::config.pruning_constant = pruning_constant;
	cout
		<< "--------------------------------------------------------------------------------"
		<< endl;

	root->Free(*model_);
	delete root;

	return used_time;
}